

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

bool __thiscall Clasp::ClaspFacade::interrupt(ClaspFacade *this,int signal)

{
  int sig;
  bool bVar1;
  ulong uVar2;
  
  uVar2 = (this->solve_).ptr_ & 0xfffffffffffffffe;
  if (uVar2 != 0) {
    if (signal != 0) {
      if ((*(long *)(uVar2 + 0x10) != 0) && ((*(uint *)(*(long *)(uVar2 + 0x10) + 0x44) & 3) != 0))
      {
        bVar1 = SolveStrategy::interrupt(*(SolveStrategy **)(uVar2 + 0x10),signal);
        return bVar1;
      }
      if ((signal != 9) && (*(int *)(uVar2 + 0x58) == 0)) {
        LOCK();
        *(int *)(uVar2 + 0x58) = signal;
        UNLOCK();
      }
      return false;
    }
    LOCK();
    sig = *(int *)(uVar2 + 0x58);
    *(int *)(uVar2 + 0x58) = 0;
    UNLOCK();
    if (sig != 0) {
      bVar1 = SolveData::interrupt((SolveData *)((this->solve_).ptr_ & 0xfffffffffffffffe),sig);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ClaspFacade::interrupt(int signal) {
	return solve_.get() && (signal || (signal = solve_->qSig.exchange(0)) != 0) && solve_->interrupt(signal);
}